

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O2

string * __thiscall
cfd::api::json::
ExecuteDirectApi<cfd::api::json::ElementsDecodeRawTransactionRequest,cfd::api::json::ElementsDecodeRawTransactionResponse>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
          *function)

{
  ElementsDecodeRawTransactionResponse response;
  ElementsDecodeRawTransactionRequest req;
  
  ElementsDecodeRawTransactionRequest::ElementsDecodeRawTransactionRequest(&req);
  core::JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionRequest>::Deserialize
            (&req.super_JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionRequest>,
             (string *)this);
  ElementsDecodeRawTransactionResponse::ElementsDecodeRawTransactionResponse(&response);
  std::
  function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
  ::operator()((function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
                *)request_message,&req,&response);
  core::JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionResponse>::Serialize_abi_cxx11_
            (__return_storage_ptr__,
             &response.super_JsonClassBase<cfd::api::json::ElementsDecodeRawTransactionResponse>);
  ElementsDecodeRawTransactionResponse::~ElementsDecodeRawTransactionResponse(&response);
  ElementsDecodeRawTransactionRequest::~ElementsDecodeRawTransactionRequest(&req);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    throw cfd_except;
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    throw ex;
  }

  ResponseType response;
  function(&req, &response);
  return response.Serialize();
}